

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O0

bool __thiscall ON_PostEffect::operator==(ON_PostEffect *this,ON_PostEffect *pep)

{
  bool bVar1;
  bool bVar2;
  ON_XMLParameters *this_00;
  CIterator *this_01;
  wchar_t *name;
  bool local_269;
  undefined1 local_250 [8];
  ON_XMLVariant param_value2;
  ON_XMLVariant param_value1;
  ON_wString param_name;
  CIterator *it;
  bool equal;
  undefined1 local_40 [8];
  ON_PostEffectParams p2;
  ON_PostEffectParams p1;
  ON_PostEffect *pep_local;
  ON_PostEffect *this_local;
  
  bVar1 = ::operator!=(&this->_impl->_id,&pep->_impl->_id);
  if (bVar1) {
    bVar1 = false;
  }
  else if (this->_impl->_type == pep->_impl->_type) {
    bVar1 = ::operator!=(&this->_impl->_local_name,&pep->_impl->_local_name);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      ON_PostEffectParams::ON_PostEffectParams((ON_PostEffectParams *)&p2._impl);
      ON_PostEffectParams::ON_PostEffectParams((ON_PostEffectParams *)local_40);
      (*this->_vptr_ON_PostEffect[0xe])(this,&p2._impl);
      (*pep->_vptr_ON_PostEffect[0xe])(pep,local_40);
      bVar1 = true;
      this_00 = ON_PostEffectParams::AsXMLParameters((ON_PostEffectParams *)&p2._impl);
      this_01 = ON_XMLParameters::NewIterator(this_00);
      ON_wString::ON_wString((ON_wString *)(param_value1._PRIVATE + 0xe0));
      ::ON_XMLVariant::ON_XMLVariant((ON_XMLVariant *)(param_value2._PRIVATE + 0xe0));
      ::ON_XMLVariant::ON_XMLVariant((ON_XMLVariant *)local_250);
      while( true ) {
        local_269 = false;
        if (bVar1) {
          local_269 = ON_XMLParameters::CIterator::Next
                                (this_01,(ON_wString *)(param_value1._PRIVATE + 0xe0),
                                 (ON_XMLVariant *)(param_value2._PRIVATE + 0xe0));
        }
        if (local_269 == false) break;
        name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)(param_value1._PRIVATE + 0xe0));
        bVar2 = ON_PostEffectParams::GetParam
                          ((ON_PostEffectParams *)local_40,name,(ON_XMLVariant *)local_250);
        if (!bVar2) {
          bVar1 = false;
        }
        bVar2 = ::ON_XMLVariant::operator!=
                          ((ON_XMLVariant *)(param_value2._PRIVATE + 0xe0),
                           (ON_XMLVariant *)local_250);
        if (bVar2) {
          bVar1 = false;
        }
      }
      if (this_01 != (CIterator *)0x0) {
        (*this_01->_vptr_CIterator[1])();
      }
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)local_250);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)(param_value2._PRIVATE + 0xe0));
      ON_wString::~ON_wString((ON_wString *)(param_value1._PRIVATE + 0xe0));
      ON_PostEffectParams::~ON_PostEffectParams((ON_PostEffectParams *)local_40);
      ON_PostEffectParams::~ON_PostEffectParams((ON_PostEffectParams *)&p2._impl);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_PostEffect::operator == (const ON_PostEffect& pep) const
{
  if (_impl->_id         != pep._impl->_id)         return false;
  if (_impl->_type       != pep._impl->_type)       return false;
  if (_impl->_local_name != pep._impl->_local_name) return false;

  ON_PostEffectParams p1, p2;
  GetAllParameters(p1);
  pep.GetAllParameters(p2);

  bool equal = true;
  auto* it = p1.AsXMLParameters().NewIterator();

  ON_wString param_name;
  ON_XMLVariant param_value1, param_value2;
  while (equal && it->Next(param_name, param_value1))
  {
    if (!p2.GetParam(param_name, param_value2))
      equal = false;

    if (param_value1 != param_value2)
      equal = false;
  }

  delete it;

  return equal;
}